

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

size_t Catch::listTags(Config *config)

{
  TestCaseFilters *pTVar1;
  size_t sVar2;
  bool bVar3;
  int iVar4;
  IRegistryHub *pIVar5;
  undefined4 extraout_var;
  long *plVar6;
  iterator iVar7;
  _Rb_tree_node_base *p_Var8;
  ostream *poVar9;
  _Base_ptr p_Var10;
  size_type *psVar11;
  long lVar12;
  TestCaseFilters *this;
  char cVar13;
  char *pcVar14;
  ulong uVar15;
  ulong uVar16;
  TestCase *testCase;
  string tagName;
  Text wrapper;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  tagCounts;
  key_type local_128;
  Config *local_108;
  TestCase *local_100;
  undefined1 local_f8 [8];
  _Alloc_hider local_f0;
  char local_e8 [8];
  char local_e0 [40];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  local_a0;
  TextAttributes local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((config->m_filterSets).
      super__Vector_base<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (config->m_filterSets).
      super__Vector_base<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pcVar14 = "All available tags:\n";
    lVar12 = 0x14;
  }
  else {
    pcVar14 = "Matching tags:\n";
    lVar12 = 0xf;
  }
  local_108 = config;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar14,lVar12);
  pIVar5 = getRegistryHub();
  iVar4 = (*pIVar5->_vptr_IRegistryHub[3])(pIVar5);
  plVar6 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar4) + 0x10))
                             ((long *)CONCAT44(extraout_var,iVar4));
  testCase = (TestCase *)*plVar6;
  local_100 = (TestCase *)plVar6[1];
  local_a0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_a0._M_impl.super__Rb_tree_header._M_header;
  local_a0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_a0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_a0._M_impl.super__Rb_tree_header._M_header._M_left;
  if (testCase != local_100) {
    uVar16 = 0;
    do {
      pTVar1 = (local_108->m_filterSets).
               super__Vector_base<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      for (this = (local_108->m_filterSets).
                  super__Vector_base<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>
                  ._M_impl.super__Vector_impl_data._M_start; this != pTVar1; this = this + 1) {
        bVar3 = TestCaseFilters::shouldInclude(this,testCase);
        if (!bVar3) goto LAB_001419a2;
      }
      for (p_Var8 = (testCase->super_TestCaseInfo).tags._M_t._M_impl.super__Rb_tree_header._M_header
                    ._M_left;
          (_Rb_tree_header *)p_Var8 !=
          &(testCase->super_TestCaseInfo).tags._M_t._M_impl.super__Rb_tree_header;
          p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
        local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_128,*(long *)(p_Var8 + 1),
                   (long)&(p_Var8[1]._M_parent)->_M_color + *(long *)(p_Var8 + 1));
        if (uVar16 <= local_128._M_string_length) {
          uVar16 = local_128._M_string_length;
        }
        iVar7 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                ::find(&local_a0,&local_128);
        if ((_Rb_tree_header *)iVar7._M_node == &local_a0._M_impl.super__Rb_tree_header) {
          local_f8 = (undefined1  [8])local_e8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_f8,local_128._M_dataplus._M_p,
                     local_128._M_dataplus._M_p + local_128._M_string_length);
          local_e0[8] = '\x01';
          local_e0[9] = '\0';
          local_e0[10] = '\0';
          local_e0[0xb] = '\0';
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,int>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                      *)&local_a0,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                      *)local_f8);
          if (local_f8 != (undefined1  [8])local_e8) {
            operator_delete((void *)local_f8);
          }
        }
        else {
          iVar7._M_node[2]._M_color = iVar7._M_node[2]._M_color + _S_black;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != &local_128.field_2) {
          operator_delete(local_128._M_dataplus._M_p);
        }
      }
LAB_001419a2:
      testCase = testCase + 1;
    } while (testCase != local_100);
    uVar15 = 0x46;
    if (uVar16 + 4 < 0x46) {
      uVar15 = uVar16 + 4;
    }
    if ((_Rb_tree_header *)local_a0._M_impl.super__Rb_tree_header._M_header._M_left !=
        &local_a0._M_impl.super__Rb_tree_header) {
      local_108 = (Config *)(uVar15 + 2);
      p_Var10 = local_a0._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        std::operator+(&local_50,"[",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var10 + 1));
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
        psVar11 = (size_type *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_128.field_2._M_allocated_capacity = *psVar11;
          local_128.field_2._8_8_ = plVar6[3];
          local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
        }
        else {
          local_128.field_2._M_allocated_capacity = *psVar11;
          local_128._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_128._M_string_length = plVar6[1];
        *plVar6 = (long)psVar11;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        local_70.initialIndent = 0xffffffffffffffff;
        local_70.tabChar = '\t';
        local_70.indent = 2;
        local_70.width = uVar15;
        Text::Text((Text *)local_f8,&local_128,&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != &local_128.field_2) {
          operator_delete(local_128._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        operator<<((ostream *)&std::cout,(Text *)local_f8);
        uVar16 = local_b8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1]._M_string_length;
        (**(code **)(*Colour::impl + 0x10))(Colour::impl,0x17);
        cVar13 = (char)local_108 - (char)uVar16;
        if (uVar15 <= uVar16) {
          cVar13 = '\x02';
        }
        local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_128,cVar13);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,local_128._M_dataplus._M_p,local_128._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != &local_128.field_2) {
          operator_delete(local_128._M_dataplus._M_p);
        }
        (**(code **)(*Colour::impl + 0x10))(Colour::impl,0);
        poVar9 = (ostream *)std::ostream::operator<<(&std::cout,p_Var10[2]._M_color);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_b8);
        if (local_f8 != (undefined1  [8])local_e8) {
          operator_delete((void *)local_f8);
        }
        p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
      } while ((_Rb_tree_header *)p_Var10 != &local_a0._M_impl.super__Rb_tree_header);
    }
  }
  sVar2 = local_a0._M_impl.super__Rb_tree_header._M_node_count;
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"tag","");
  local_f8 = (undefined1  [8])sVar2;
  local_f0._M_p = local_e0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f0,local_128._M_dataplus._M_p,
             local_128._M_dataplus._M_p + local_128._M_string_length);
  poVar9 = operator<<((ostream *)&std::cout,(pluralise *)local_f8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  if (local_f0._M_p != local_e0) {
    operator_delete(local_f0._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p);
  }
  sVar2 = local_a0._M_impl.super__Rb_tree_header._M_node_count;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(&local_a0);
  return (size_t)(pointer)sVar2;
}

Assistant:

static bool evaluate( T1 const& lhs, T2 const& rhs) {
            return opCast( lhs ) ==  opCast( rhs );
        }